

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddSymm.c
# Opt level: O3

DdNode * Extra_zddTuplesFromBdd(DdManager *dd,int K,DdNode *bVarsN)

{
  int iVar1;
  int iVar2;
  int iVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  
  iVar1 = dd->autoDynZ;
  dd->autoDynZ = 0;
  while( true ) {
    pDVar4 = dd->one;
    iVar2 = 0;
    if (pDVar4 != bVarsN) {
      iVar2 = 0;
      pDVar5 = bVarsN;
      do {
        if ((pDVar5->type).kids.E != (DdNode *)((ulong)pDVar4 ^ 1)) {
          return (DdNode *)0x0;
        }
        iVar2 = iVar2 + 1;
        pDVar5 = (pDVar5->type).kids.T;
      } while (pDVar5 != pDVar4);
    }
    iVar3 = iVar2 - K;
    if (iVar2 < K) break;
    pDVar4 = bVarsN;
    if (iVar3 != 0 && K <= iVar2) {
      do {
        pDVar4 = (pDVar4->type).kids.T;
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
    dd->reordered = 0;
    pDVar4 = extraZddTuplesFromBdd(dd,pDVar4,bVarsN);
    if (dd->reordered != 1) {
      dd->autoDynZ = iVar1;
      return pDVar4;
    }
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode* Extra_zddTuplesFromBdd( 
  DdManager * dd,   /* the DD manager */
  int K,            /* the number of variables in tuples */
  DdNode * bVarsN)   /* the set of all variables represented as a BDD */
{
    DdNode  *zRes;
    int     autoDynZ;

    autoDynZ = dd->autoDynZ;
    dd->autoDynZ = 0;

    do {
        /* transform the numeric arguments (K) into a DdNode* argument;
         * this allows us to use the standard internal CUDD cache */
        DdNode *bVarSet = bVarsN, *bVarsK = bVarsN;
        int     nVars = 0, i;

        /* determine the number of variables in VarSet */
        while ( bVarSet != b1 )
        {
            nVars++;
            /* make sure that the VarSet is a cube */
            if ( cuddE( bVarSet ) != b0 )
                return NULL;
            bVarSet = cuddT( bVarSet );
        }
        /* make sure that the number of variables in VarSet is less or equal 
           that the number of variables that should be present in the tuples
        */
        if ( K > nVars )
            return NULL;

        /* the second argument in the recursive call stannds for <n>;
         * reate the first argument, which stands for <k>
         * as when we are talking about the tuple of <k> out of <n> */
        for ( i = 0; i < nVars-K; i++ )
            bVarsK = cuddT( bVarsK );

        dd->reordered = 0;
        zRes = extraZddTuplesFromBdd(dd, bVarsK, bVarsN );

    } while (dd->reordered == 1);
    dd->autoDynZ = autoDynZ;
    return zRes;

}